

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O3

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<5>::
DecodeInternal<draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (DynamicIntegerPointsKdTreeDecoder<5> *this,uint32_t num_points,
          PointAttributeVectorOutputIterator<unsigned_int> *oit)

{
  PointIndex *pPVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  int *piVar3;
  uint32_t uVar4;
  pointer pvVar5;
  void *pvVar6;
  DecodingStatus *pDVar7;
  uint *puVar8;
  PointAttributeVectorOutputIterator<unsigned_int> *pPVar9;
  bool bVar10;
  pointer puVar11;
  uint32_t uVar12;
  _Elt_pointer pDVar13;
  ulong uVar14;
  pointer puVar15;
  pointer pvVar16;
  uint uVar17;
  uint32_t uVar18;
  uint uVar19;
  int nbits;
  uint32_t result;
  uint32_t uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  RAnsBitDecoder *this_00;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
  status_stack;
  DecodingStatus local_f0;
  uint32_t local_e4;
  long local_e0;
  DecodingStatus local_d4;
  PointAttributeVectorOutputIterator<unsigned_int> *local_c8;
  ulong local_c0;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>
  local_b8;
  ulong local_60;
  ulong local_58;
  RAnsBitDecoder *local_50;
  VectorUint32 *local_48;
  ulong local_40;
  DirectBitDecoder *local_38;
  
  local_d4.num_remaining_points = 0;
  local_e4 = num_points;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,
             (ulong)this->dimension_,&local_d4.num_remaining_points,(allocator_type *)&local_f0);
  pvVar5 = (this->base_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar11 = *(pointer *)
             ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_b8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_b8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_b8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar6 != (void *)0x0) &&
     (operator_delete(pvVar6,(long)puVar11 - (long)pvVar6),
     local_b8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_b8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_b8._M_impl.super__Deque_impl_data._M_map);
  }
  local_d4.num_remaining_points = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,
             (ulong)this->dimension_,&local_d4.num_remaining_points,(allocator_type *)&local_f0);
  pvVar5 = (this->levels_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar11 = *(pointer *)
             ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_b8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_b8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_b8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar6 != (void *)0x0) &&
     (operator_delete(pvVar6,(long)puVar11 - (long)pvVar6),
     local_b8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_b8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_b8._M_impl.super__Deque_impl_data._M_map);
  }
  local_d4.num_remaining_points = local_e4;
  local_d4.last_axis = 0;
  local_d4.stack_pos = 0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>
  ::_M_initialize_map(&local_b8,0);
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>>
                *)&local_b8,&local_d4);
  }
  else {
    (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_d4.stack_pos;
    (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_d4.num_remaining_points;
    (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_d4.last_axis;
    local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_50 = (RAnsBitDecoder *)&this->numbers_decoder_;
    local_48 = &this->p_;
    local_38 = &this->remaining_bits_decoder_;
    local_c8 = oit;
    do {
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar7 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        uVar17 = pDVar7[0x29].num_remaining_points;
        uVar24 = pDVar7[0x29].last_axis;
        uVar19 = pDVar7[0x29].stack_pos;
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        pDVar13 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pDVar13 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        uVar17 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].num_remaining_points;
        uVar24 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].last_axis;
        uVar19 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].stack_pos;
      }
      pPVar9 = local_c8;
      uVar23 = (ulong)uVar19;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = pDVar13;
      if (local_e4 < uVar17) {
LAB_00146268:
        bVar10 = false;
        goto LAB_0014626a;
      }
      uVar22 = (ulong)(uVar24 + 1);
      if (this->dimension_ - 1 == uVar24) {
        uVar22 = 0;
      }
      uVar21 = (uint)uVar22;
      if (this->dimension_ <= uVar21) goto LAB_00146268;
      pvVar5 = (this->base_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = pvVar5 + uVar23;
      pvVar16 = (this->levels_stack_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar23;
      uVar24 = *(uint32_t *)
                (*(long *)&(pvVar16->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data + uVar22 * 4);
      local_40 = uVar23;
      local_c0 = uVar22;
      if (this->bit_length_ == uVar24) {
        for (; uVar17 != 0; uVar17 = uVar17 - 1) {
          PointAttributeVectorOutputIterator<unsigned_int>::operator=(pPVar9,pvVar2);
          pPVar1 = &pPVar9->point_id_;
          pPVar1->value_ = pPVar1->value_ + 1;
          this->num_decoded_points_ = this->num_decoded_points_ + 1;
        }
      }
      else {
        if (2 < uVar17) {
          if (this->num_decoded_points_ <= this->num_points_) {
            local_e0 = CONCAT44(local_e0._4_4_,this->bit_length_);
            uVar22 = (ulong)(uVar19 + 1);
            local_60 = uVar22;
            local_58 = uVar23;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (pvVar5 + uVar22,pvVar2);
            piVar3 = (int *)(*(long *)&(this->base_stack_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + local_c0 * 4);
            *piVar3 = *piVar3 + (1 << ((char)local_e0 + ~(byte)uVar24 & 0x1f));
            uVar19 = 0x1f;
            if (uVar17 != 0) {
              for (; uVar17 >> uVar19 == 0; uVar19 = uVar19 - 1) {
              }
            }
            uVar23 = (ulong)uVar19;
            uVar19 = 0;
            this_00 = local_50;
            local_e0 = uVar22 * 3;
            do {
              bVar10 = RAnsBitDecoder::DecodeNextBit(this_00);
              uVar19 = (uint)bVar10 + uVar19 * 2;
              this_00 = this_00 + 1;
              uVar23 = uVar23 - 1;
            } while (uVar23 != 0);
            uVar24 = (uVar17 >> 1) - uVar19;
            if (uVar19 <= uVar17 >> 1) {
              uVar18 = uVar17 - uVar24;
              uVar25 = uVar24;
              uVar20 = uVar24;
              if ((uVar24 != uVar18) &&
                 (puVar8 = (this->half_decoder_).pos_._M_current, uVar20 = uVar18,
                 puVar8 != (this->half_decoder_).bits_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish)) {
                uVar4 = (this->half_decoder_).num_used_bits_;
                uVar17 = *puVar8;
                uVar12 = uVar4 + 1;
                (this->half_decoder_).num_used_bits_ = uVar12;
                if (uVar12 == 0x20) {
                  (this->half_decoder_).pos_._M_current = puVar8 + 1;
                  (this->half_decoder_).num_used_bits_ = 0;
                }
                if ((0x80000000U >> ((byte)uVar4 & 0x1f) & uVar17) != 0) {
                  uVar25 = uVar18;
                  uVar20 = uVar24;
                }
              }
              pvVar5 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar2 = pvVar5 + local_40;
              puVar11 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start + local_c0;
              *puVar11 = *puVar11 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)&(pvVar5->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + local_e0 * 8),pvVar2);
              if (uVar20 != 0) {
                local_f0.stack_pos = (uint32_t)local_58;
                local_f0.num_remaining_points = uVar20;
                local_f0.last_axis = uVar21;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>
                            *)&local_b8,&local_f0);
              }
              if (uVar25 != 0) {
                local_f0.stack_pos = (uint32_t)local_60;
                local_f0.num_remaining_points = uVar25;
                local_f0.last_axis = uVar21;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>
                            *)&local_b8,&local_f0);
              }
              goto LAB_00146254;
            }
          }
          goto LAB_00146268;
        }
        puVar11 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *puVar11 = uVar21;
        uVar23 = (ulong)this->dimension_;
        if (1 < this->dimension_) {
          uVar14 = 1;
          do {
            uVar19 = (int)uVar22 + 1;
            if ((int)uVar22 == (int)uVar23 + -1) {
              uVar19 = 0;
            }
            puVar11[uVar14] = uVar19;
            uVar14 = uVar14 + 1;
            uVar23 = (ulong)this->dimension_;
            uVar22 = (ulong)uVar19;
          } while (uVar14 < uVar23);
        }
        if (uVar17 != 0) {
          uVar19 = 0;
          do {
            if (this->dimension_ != 0) {
              puVar11 = (this->p_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              puVar15 = (this->axes_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar23 = 0;
              do {
                puVar11[puVar15[uVar23]] = 0;
                uVar22 = (ulong)puVar15[uVar23];
                nbits = this->bit_length_ -
                        *(int *)(*(long *)&(pvVar16->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data + uVar22 * 4);
                if (nbits != 0) {
                  bVar10 = DirectBitDecoder::DecodeLeastSignificantBits32
                                     (local_38,nbits,puVar11 + uVar22);
                  if (!bVar10) goto LAB_00146268;
                  puVar11 = (this->p_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  puVar15 = (this->axes_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar22 = (ulong)puVar15[uVar23];
                }
                puVar11[uVar22] =
                     puVar11[uVar22] |
                     (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar22];
                uVar23 = uVar23 + 1;
              } while (uVar23 < this->dimension_);
            }
            pPVar9 = local_c8;
            PointAttributeVectorOutputIterator<unsigned_int>::operator=(local_c8,local_48);
            (pPVar9->point_id_).value_ = (pPVar9->point_id_).value_ + 1;
            this->num_decoded_points_ = this->num_decoded_points_ + 1;
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar17);
        }
      }
LAB_00146254:
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  bVar10 = true;
LAB_0014626a:
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>
  ::~_Deque_base(&local_b8);
  return bVar10;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}